

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeINTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  uint uVar1;
  WhereLoop *pWVar2;
  Index *pIVar3;
  Expr *p;
  Vdbe *p_00;
  WhereInfo *pWVar4;
  InLoop *__src;
  size_t __n;
  sqlite3 *db;
  ExprList *pList;
  Expr *pEVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  u32 uVar12;
  WhereMemBlock *pWVar13;
  long lVar14;
  Expr *pX;
  ExprList *pList_00;
  int iVar15;
  Select *pSVar16;
  u8 uVar17;
  ulong uVar18;
  InLoop *pIVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar43;
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar49 [16];
  Expr *pExpr;
  int *local_b0;
  ExprList *local_a8;
  ExprList *local_88;
  byte local_68;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = pLevel->pWLoop;
  if ((((pWVar2->wsFlags & 0x400) == 0) &&
      (pIVar3 = (pWVar2->u).btree.pIndex, pIVar3 != (Index *)0x0)) &&
     (pIVar3->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  p = pTerm->pExpr;
  p_00 = pParse->pVdbe;
  if (0 < iEq) {
    uVar18 = 0;
    do {
      if ((pWVar2->aLTerm[uVar18] != (WhereTerm *)0x0) && (pWVar2->aLTerm[uVar18]->pExpr == p)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          disableTerm(pLevel,pTerm);
          return;
        }
        goto LAB_001a04c4;
      }
      uVar18 = uVar18 + 1;
    } while ((uint)iEq != uVar18);
  }
  iVar9 = 0;
  if (iEq < (int)(uint)pWVar2->nLTerm) {
    uVar18 = (ulong)iEq;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)(pWVar2->aLTerm[uVar18]->pExpr == p);
      uVar18 = uVar18 + 1;
    } while (pWVar2->nLTerm != uVar18);
  }
  local_3c = 0;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_b0 = (int *)0x0;
    iVar10 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,(int *)0x0,&local_3c);
    goto LAB_0019fb92;
  }
  if (((p->flags >> 0x19 & 1) == 0) || (p->iTable == 0)) {
    db = pParse->db;
    local_b0 = (int *)0x0;
    pX = exprDup(db,p,0,(EdupBuf *)0x0);
    iVar10 = 5;
    if (db->mallocFailed == '\0') {
      pSVar16 = (pX->x).pSelect;
      if (pSVar16 != (Select *)0x0) {
        do {
          if (pSVar16 == (Select *)(pX->x).pList) {
            local_88 = (pX->pLeft->x).pList;
          }
          else {
            local_88 = (ExprList *)0x0;
          }
          pList = pSVar16->pEList;
          if (iEq < (int)(uint)pWVar2->nLTerm) {
            local_a8 = (ExprList *)0x0;
            pList_00 = (ExprList *)0x0;
            lVar20 = (long)iEq;
            do {
              if (pWVar2->aLTerm[lVar20]->pExpr == p) {
                iVar10 = (pWVar2->aLTerm[lVar20]->u).x.iField;
                pEVar5 = pList->a[(long)iVar10 + -1].pExpr;
                if (pEVar5 != (Expr *)0x0) {
                  pList_00 = sqlite3ExprListAppend(pParse,pList_00,pEVar5);
                  pList->a[(long)iVar10 + -1].pExpr = (Expr *)0x0;
                  if (pList_00 != (ExprList *)0x0) {
                    pList_00->a[(long)pList_00->nExpr + -1].u.x.iOrderByCol = (u16)iVar10;
                  }
                  if (local_88 != (ExprList *)0x0) {
                    local_a8 = sqlite3ExprListAppend
                                         (pParse,local_a8,local_88->a[(long)iVar10 + -1].pExpr);
                    local_88->a[(long)iVar10 + -1].pExpr = (Expr *)0x0;
                  }
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < (long)(ulong)pWVar2->nLTerm);
          }
          else {
            pList_00 = (ExprList *)0x0;
            local_a8 = (ExprList *)0x0;
          }
          if (pList != (ExprList *)0x0) {
            exprListDeleteNN(db,pList);
          }
          if (local_88 != (ExprList *)0x0) {
            exprListDeleteNN(db,local_88);
            (pX->pLeft->x).pList = local_a8;
          }
          pSVar16->pEList = pList_00;
          uVar12 = pParse->nSelect + 1;
          pParse->nSelect = uVar12;
          pSVar16->selId = uVar12;
          if ((local_a8 != (ExprList *)0x0) && (local_a8->nExpr == 1)) {
            pEVar5 = local_a8->a[0].pExpr;
            local_a8->a[0].pExpr = (Expr *)0x0;
            if (pX->pLeft != (Expr *)0x0) {
              sqlite3ExprDeleteNN(db,pX->pLeft);
            }
            pX->pLeft = pEVar5;
          }
          if (pList_00 != (ExprList *)0x0) {
            adjustOrderByCol(pSVar16->pOrderBy,pList_00);
            adjustOrderByCol(pSVar16->pGroupBy,pList_00);
            auVar8 = _DAT_001ff0a0;
            iVar10 = pList_00->nExpr;
            if (0 < (long)iVar10) {
              lVar20 = (long)iVar10 + -1;
              auVar23._8_4_ = (int)lVar20;
              auVar23._0_8_ = lVar20;
              auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
              auVar23 = auVar23 ^ _DAT_001ff0a0;
              lVar20 = 0;
              auVar25 = _DAT_001ff090;
              auVar26 = _DAT_001ff080;
              auVar27 = _DAT_001ff070;
              auVar28 = _DAT_001ff060;
              do {
                auVar29 = auVar25 ^ auVar8;
                iVar43 = auVar23._0_4_;
                iVar42 = -(uint)(iVar43 < auVar29._0_4_);
                iVar15 = auVar23._4_4_;
                auVar30._4_4_ = -(uint)(iVar15 < auVar29._4_4_);
                iVar11 = auVar23._8_4_;
                iVar46 = -(uint)(iVar11 < auVar29._8_4_);
                iVar24 = auVar23._12_4_;
                auVar30._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar39._4_4_ = iVar42;
                auVar39._0_4_ = iVar42;
                auVar39._8_4_ = iVar46;
                auVar39._12_4_ = iVar46;
                auVar47 = pshuflw(in_XMM8,auVar39,0xe8);
                auVar32._4_4_ = -(uint)(auVar29._4_4_ == iVar15);
                auVar32._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar49 = pshuflw(in_XMM9,auVar32,0xe8);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar48 = pshuflw(auVar47,auVar30,0xe8);
                auVar29._8_4_ = 0xffffffff;
                auVar29._0_8_ = 0xffffffffffffffff;
                auVar29._12_4_ = 0xffffffff;
                auVar29 = (auVar48 | auVar49 & auVar47) ^ auVar29;
                auVar29 = packssdw(auVar29,auVar29);
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pList_00->a[0].u + lVar20) = 0;
                }
                auVar30 = auVar32 & auVar39 | auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar48,auVar29 ^ auVar48);
                if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)((long)&pList_00[1].a[0].zEName + lVar20 + 4) = 0;
                }
                auVar29 = auVar26 ^ auVar8;
                iVar42 = -(uint)(iVar43 < auVar29._0_4_);
                auVar44._4_4_ = -(uint)(iVar15 < auVar29._4_4_);
                iVar46 = -(uint)(iVar11 < auVar29._8_4_);
                auVar44._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar31._4_4_ = iVar42;
                auVar31._0_4_ = iVar42;
                auVar31._8_4_ = iVar46;
                auVar31._12_4_ = iVar46;
                auVar38._4_4_ = -(uint)(auVar29._4_4_ == iVar15);
                auVar38._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar29 = auVar38 & auVar31 | auVar44;
                auVar29 = packssdw(auVar29,auVar29);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar6,auVar29 ^ auVar6);
                if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pList_00[2].a[0].pExpr + lVar20 + 4) = 0;
                }
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar39 = pshufhw(auVar38,auVar38,0x84);
                auVar30 = pshufhw(auVar32,auVar44,0x84);
                auVar33._8_4_ = 0xffffffff;
                auVar33._0_8_ = 0xffffffffffffffff;
                auVar33._12_4_ = 0xffffffff;
                auVar33 = (auVar30 | auVar39 & auVar32) ^ auVar33;
                auVar32 = packssdw(auVar33,auVar33);
                if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pList_00[3].a + lVar20 + -4) = 0;
                }
                auVar32 = auVar27 ^ auVar8;
                iVar42 = -(uint)(iVar43 < auVar32._0_4_);
                auVar35._4_4_ = -(uint)(iVar15 < auVar32._4_4_);
                iVar46 = -(uint)(iVar11 < auVar32._8_4_);
                auVar35._12_4_ = -(uint)(iVar24 < auVar32._12_4_);
                auVar40._4_4_ = iVar42;
                auVar40._0_4_ = iVar42;
                auVar40._8_4_ = iVar46;
                auVar40._12_4_ = iVar46;
                auVar29 = pshuflw(auVar29,auVar40,0xe8);
                auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar15);
                auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar24);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                in_XMM9 = pshuflw(auVar49 & auVar47,auVar34,0xe8);
                in_XMM9 = in_XMM9 & auVar29;
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar29 = pshuflw(auVar29,auVar35,0xe8);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar47 = (auVar29 | in_XMM9) ^ auVar47;
                auVar29 = packssdw(auVar47,auVar47);
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pList_00[3].a[0].u + lVar20) = 0;
                }
                auVar35 = auVar34 & auVar40 | auVar35;
                auVar29 = packssdw(auVar35,auVar35);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar49,auVar29 ^ auVar49);
                if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pList_00[4].a[0].zEName + lVar20 + 4) = 0;
                }
                auVar29 = auVar28 ^ auVar8;
                iVar43 = -(uint)(iVar43 < auVar29._0_4_);
                auVar45._4_4_ = -(uint)(iVar15 < auVar29._4_4_);
                iVar11 = -(uint)(iVar11 < auVar29._8_4_);
                auVar45._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar36._4_4_ = iVar43;
                auVar36._0_4_ = iVar43;
                auVar36._8_4_ = iVar11;
                auVar36._12_4_ = iVar11;
                auVar41._4_4_ = -(uint)(auVar29._4_4_ == iVar15);
                auVar41._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar29 = auVar41 & auVar36 | auVar45;
                auVar29 = packssdw(auVar29,auVar29);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar29 ^ auVar7,auVar29 ^ auVar7);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pList_00[5].a[0].pExpr + lVar20 + 4) = 0;
                }
                auVar29 = pshufhw(auVar36,auVar36,0x84);
                auVar30 = pshufhw(auVar41,auVar41,0x84);
                auVar32 = pshufhw(auVar29,auVar45,0x84);
                auVar37._8_4_ = 0xffffffff;
                auVar37._0_8_ = 0xffffffffffffffff;
                auVar37._12_4_ = 0xffffffff;
                auVar37 = (auVar32 | auVar30 & auVar29) ^ auVar37;
                auVar29 = packssdw(auVar37,auVar37);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pList_00[6].a + lVar20 + -4) = 0;
                }
                lVar22 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + 8;
                auVar25._8_8_ = lVar22 + 8;
                lVar22 = auVar26._8_8_;
                auVar26._0_8_ = auVar26._0_8_ + 8;
                auVar26._8_8_ = lVar22 + 8;
                lVar22 = auVar27._8_8_;
                auVar27._0_8_ = auVar27._0_8_ + 8;
                auVar27._8_8_ = lVar22 + 8;
                lVar22 = auVar28._8_8_;
                auVar28._0_8_ = auVar28._0_8_ + 8;
                auVar28._8_8_ = lVar22 + 8;
                lVar20 = lVar20 + 0xc0;
              } while ((ulong)(iVar10 + 7U >> 3) * 0xc0 != lVar20);
            }
          }
          pSVar16 = pSVar16->pPrior;
        } while (pSVar16 != (Select *)0x0);
        iVar10 = 5;
        if (db->mallocFailed != '\0') {
          local_b0 = (int *)0x0;
          goto LAB_001a04a5;
        }
      }
      local_b0 = (int *)sqlite3DbMallocZero(pParse->db,(long)iVar9 * 4);
      iVar10 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,local_b0,&local_3c);
      p->iTable = local_3c;
    }
LAB_001a04a5:
    if (pX != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pX);
    }
    goto LAB_0019fb92;
  }
  pSVar16 = (Select *)p->pLeft;
  uVar17 = pSVar16->op;
  if (uVar17 == 0xb0) {
    uVar17 = (u8)pSVar16->nSelectRow;
  }
  if (uVar17 == 0xb1) {
LAB_0019fecc:
    iVar10 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar16->pEList)->pList->nExpr;
  }
  else {
    iVar10 = 1;
    if (uVar17 == 0x8b) {
      pSVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar16->pEList)->pSelect;
      goto LAB_0019fecc;
    }
  }
  if (iVar10 < iVar9) {
    iVar10 = iVar9;
  }
  local_b0 = (int *)sqlite3DbMallocZero(pParse->db,(long)iVar10 << 2);
  iVar10 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,local_b0,&local_3c);
LAB_0019fb92:
  iVar43 = local_3c;
  uVar21 = (uint)(bRev == 0);
  if (iVar10 != 4) {
    uVar21 = bRev;
  }
  sqlite3VdbeAddOp3(p_00,(uint)(uVar21 == 0) * 4 + 0x20,local_3c,0,0);
  uVar1 = pWVar2->wsFlags;
  pWVar2->wsFlags = uVar1 | 0x800;
  if ((pLevel->u).in.nIn == 0) {
    iVar15 = pParse->nLabel + -1;
    pParse->nLabel = iVar15;
    pLevel->addrNxt = iVar15;
  }
  if ((0 < iEq) && ((uVar1 & 0x100000) == 0)) {
    pWVar2->wsFlags = uVar1 | 0x40800;
  }
  lVar20 = (long)(pLevel->u).in.nIn;
  lVar22 = iVar9 + lVar20;
  (pLevel->u).in.nIn = (int)lVar22;
  pWVar4 = pTerm->pWC->pWInfo;
  __src = (pLevel->u).in.aInLoop;
  pWVar13 = (WhereMemBlock *)sqlite3DbMallocRawNN(pWVar4->pParse->db,lVar22 * 0x14 + 0x10);
  if (pWVar13 == (WhereMemBlock *)0x0) {
    (pLevel->u).in.aInLoop = (InLoop *)0x0;
    (pLevel->u).in.nIn = 0;
  }
  else {
    pWVar13->pNext = pWVar4->pMemToFree;
    pWVar13->sz = lVar22 * 0x14;
    pWVar4->pMemToFree = pWVar13;
    pIVar19 = (InLoop *)(pWVar13 + 1);
    if (__src != (InLoop *)0x0) {
      __n._0_4_ = __src[-1].nPrefix;
      __n._4_1_ = __src[-1].eEndLoopOp;
      __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
      memcpy(pIVar19,__src,__n);
    }
    (pLevel->u).in.aInLoop = pIVar19;
    uVar18 = (ulong)pWVar2->nLTerm;
    if (iEq < (int)(uint)pWVar2->nLTerm) {
      pIVar19 = pIVar19 + lVar20;
      local_68 = uVar21 == 0 | 0x26;
      lVar20 = (long)iEq;
      iVar15 = iTarget - iEq;
      lVar22 = 0;
      iVar9 = 0;
      do {
        if (pWVar2->aLTerm[lVar20]->pExpr == p) {
          if (iVar10 == 1) {
            iVar42 = 0x87;
            iVar11 = iTarget;
            iVar24 = 0;
          }
          else {
            if (local_b0 == (int *)0x0) {
              iVar11 = 0;
            }
            else {
              lVar14 = (long)iVar9;
              iVar9 = iVar9 + 1;
              iVar11 = local_b0[lVar14];
            }
            iVar42 = 0x5e;
            iVar24 = iTarget;
          }
          iVar11 = sqlite3VdbeAddOp3(p_00,iVar42,iVar43,iVar11,iVar24);
          pIVar19->addrInTop = iVar11;
          sqlite3VdbeAddOp3(p_00,0x33,iTarget,0,0);
          if (lVar22 == 0) {
            pIVar19->iCur = iVar43;
            pIVar19->eEndLoopOp = local_68;
            if (iEq < 1) {
              pIVar19->nPrefix = 0;
            }
            else {
              pIVar19->iBase = iVar15;
              pIVar19->nPrefix = iEq;
            }
          }
          else {
            pIVar19->eEndLoopOp = 0xbb;
          }
          pIVar19 = pIVar19 + 1;
          uVar18 = (ulong)pWVar2->nLTerm;
        }
        lVar20 = lVar20 + 1;
        lVar22 = lVar22 + -1;
        iTarget = iTarget + 1;
      } while (lVar20 < (long)uVar18);
    }
    if ((0 < iEq) && ((pWVar2->wsFlags & 0x100400) == 0)) {
      sqlite3VdbeAddOp3(p_00,0x7d,pLevel->iIdxCur,0,iEq);
    }
  }
  if (local_b0 == (int *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3DbFreeNN(pParse->db,local_b0);
    return;
  }
LAB_001a04c4:
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void codeINTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  int eType = IN_INDEX_NOOP;
  int iTab;
  struct InLoop *pIn;
  WhereLoop *pLoop = pLevel->pWLoop;
  Vdbe *v = pParse->pVdbe;
  int i;
  int nEq = 0;
  int *aiMap = 0;

  if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
    && pLoop->u.btree.pIndex!=0
    && pLoop->u.btree.pIndex->aSortOrder[iEq]
  ){
    testcase( iEq==0 );
    testcase( bRev );
    bRev = !bRev;
  }
  assert( pX->op==TK_IN );

  for(i=0; i<iEq; i++){
    if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
      disableTerm(pLevel, pTerm);
      return;
    }
  }
  for(i=iEq;i<pLoop->nLTerm; i++){
    assert( pLoop->aLTerm[i]!=0 );
    if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
  }

  iTab = 0;
  if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
  }else{
    Expr *pExpr = pTerm->pExpr;
    if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
        pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
    }else{
      int n = sqlite3ExprVectorSize(pX->pLeft);
      aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
    }
    pX = pExpr;
  }

  if( eType==IN_INDEX_INDEX_DESC ){
    testcase( bRev );
    bRev = !bRev;
  }
  sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
  VdbeCoverageIf(v, bRev);
  VdbeCoverageIf(v, !bRev);

  assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
  pLoop->wsFlags |= WHERE_IN_ABLE;
  if( pLevel->u.in.nIn==0 ){
    pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
  }
  if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
    pLoop->wsFlags |= WHERE_IN_EARLYOUT;
  }

  i = pLevel->u.in.nIn;
  pLevel->u.in.nIn += nEq;
  pLevel->u.in.aInLoop =
     sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                         pLevel->u.in.aInLoop,
                         sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
  pIn = pLevel->u.in.aInLoop;
  if( pIn ){
    int iMap = 0;               /* Index in aiMap[] */
    pIn += i;
    for(i=iEq;i<pLoop->nLTerm; i++){
      if( pLoop->aLTerm[i]->pExpr==pX ){
        int iOut = iTarget + i - iEq;
        if( eType==IN_INDEX_ROWID ){
          pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
        }else{
          int iCol = aiMap ? aiMap[iMap++] : 0;
          pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
        }
        sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
        if( i==iEq ){
          pIn->iCur = iTab;
          pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
          if( iEq>0 ){
            pIn->iBase = iTarget - i;
            pIn->nPrefix = i;
          }else{
            pIn->nPrefix = 0;
          }
        }else{
          pIn->eEndLoopOp = OP_Noop;
        }
        pIn++;
      }
    }
    testcase( iEq>0
              && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
              && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
    if( iEq>0
     && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
    ){
      sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
    }
  }else{
    pLevel->u.in.nIn = 0;
  }
  sqlite3DbFree(pParse->db, aiMap);
}